

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O0

int ffu2fstr(unsigned_short *input,long ntodo,double scale,double zero,char *cform,long twidth,
            char *output,int *status)

{
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  int *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  char *cptr;
  double dvalue;
  long ii;
  char *local_58;
  long local_48;
  char *local_38;
  
  local_58 = in_R8;
  local_38 = in_R8;
  if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
    for (local_48 = 0; local_48 < in_RSI; local_48 = local_48 + 1) {
      snprintf(local_38,0x7080,in_RDX,
               ((double)*(ushort *)(in_RDI + local_48 * 2) - in_XMM1_Qa) / in_XMM0_Qa);
      local_38 = local_38 + in_RCX;
      if (*local_38 != '\0') {
        *in_R9 = -0xb;
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < in_RSI; local_48 = local_48 + 1) {
      snprintf(local_38,0x7080,in_RDX,(double)*(ushort *)(in_RDI + local_48 * 2));
      local_38 = local_38 + in_RCX;
      if (*local_38 != '\0') {
        *in_R9 = -0xb;
      }
    }
  }
  while (local_58 = strchr(local_58,0x2c), local_58 != (char *)0x0) {
    *local_58 = '.';
  }
  return *in_R9;
}

Assistant:

int ffu2fstr(unsigned short *input, /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            char *cform,       /* I - format for output string values  */
            long twidth,       /* I - width of each field, in chars    */
            char *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do scaling if required.
*/
{
    long ii;
    double dvalue;
    char *cptr;
    
    cptr = output;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
           snprintf(output, DBUFFSIZE, cform, (double) input[ii]);
           output += twidth;

           if (*output)  /* if this char != \0, then overflow occurred */
              *status = OVERFLOW_ERR;
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
          dvalue = ((double) input[ii] - zero) / scale;
          snprintf(output, DBUFFSIZE, cform, dvalue);
          output += twidth;

          if (*output)  /* if this char != \0, then overflow occurred */
            *status = OVERFLOW_ERR;
        }
    }

    /* replace any commas with periods (e.g., in French locale) */
    while ((cptr = strchr(cptr, ','))) *cptr = '.';
    
    return(*status);
}